

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::cmLocalUnixMakefileGenerator3
          (cmLocalUnixMakefileGenerator3 *this,cmGlobalGenerator *gg,cmMakefile *mf)

{
  _Rb_tree_header *p_Var1;
  
  cmLocalCommonGenerator::cmLocalCommonGenerator(&this->super_cmLocalCommonGenerator,gg,mf);
  (this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator =
       (_func_int **)&PTR__cmLocalUnixMakefileGenerator3_005c9ce0;
  p_Var1 = &(this->ImplicitDepends).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->ImplicitDepends).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ImplicitDepends).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ImplicitDepends).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ImplicitDepends).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ImplicitDepends).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->HomeRelativeOutputPath)._M_dataplus._M_p = (pointer)&(this->HomeRelativeOutputPath).field_2
  ;
  (this->HomeRelativeOutputPath)._M_string_length = 0;
  (this->HomeRelativeOutputPath).field_2._M_local_buf[0] = '\0';
  (this->LocalHelp).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LocalHelp).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LocalHelp).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->MakeVariableMap)._M_t._M_impl.super__Rb_tree_header;
  (this->MakeVariableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MakeVariableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->MakeVariableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->MakeVariableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->MakeVariableMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ShortMakeVariableMap)._M_t._M_impl.super__Rb_tree_header;
  (this->ShortMakeVariableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ShortMakeVariableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ShortMakeVariableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ShortMakeVariableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  this->SkipAssemblySourceRules = false;
  (this->ShortMakeVariableMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->MakefileVariableSize = 0;
  this->MakeCommandEscapeTargetTwice = false;
  this->BorlandMakeCurlyHack = false;
  this->ColorMakefile = false;
  this->SkipPreprocessedSourceRules = false;
  return;
}

Assistant:

cmLocalUnixMakefileGenerator3::
cmLocalUnixMakefileGenerator3(cmGlobalGenerator* gg, cmMakefile* mf)
  : cmLocalCommonGenerator(gg, mf)
{
  this->MakefileVariableSize = 0;
  this->ColorMakefile = false;
  this->SkipPreprocessedSourceRules = false;
  this->SkipAssemblySourceRules = false;
  this->MakeCommandEscapeTargetTwice = false;
  this->BorlandMakeCurlyHack = false;
}